

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  undefined8 *puVar1;
  stbi__uint32 b;
  stbi__context *s;
  uint uVar2;
  stbi__uint32 sVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  stbi_uc *psVar7;
  byte *pbVar8;
  void *pvVar9;
  byte bVar10;
  ulong uVar11;
  byte *pbVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  stbi_uc **ppsVar13;
  uint uVar14;
  int a;
  int *piVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  int local_64;
  
  s = z->s;
  uVar2 = stbi__get16be(s);
  if (uVar2 < 0xb) {
LAB_001257c3:
    pcVar6 = "bad SOF len";
  }
  else {
    psVar7 = s->img_buffer;
    if (psVar7 < s->img_buffer_end) {
LAB_001257f8:
      s->img_buffer = psVar7 + 1;
      if (*psVar7 == '\b') {
        sVar3 = stbi__get16be(s);
        s->img_y = sVar3;
        if (sVar3 == 0) {
          pcVar6 = "no header height";
          goto LAB_00125ca5;
        }
        sVar3 = stbi__get16be(s);
        s->img_x = sVar3;
        if (sVar3 == 0) {
          pcVar6 = "0 width";
          goto LAB_00125ca5;
        }
        if (0x1000000 < s->img_y) {
          pcVar6 = "too large";
          goto LAB_00125ca5;
        }
        pbVar12 = s->img_buffer;
        if (pbVar12 < s->img_buffer_end) {
LAB_0012588b:
          pbVar8 = pbVar12 + 1;
          s->img_buffer = pbVar8;
          bVar10 = *pbVar12;
          uVar20 = (ulong)bVar10;
          if ((bVar10 < 5) && ((0x1aU >> (bVar10 & 0x1f) & 1) != 0)) {
            s->img_n = (uint)bVar10;
            uVar11 = (ulong)(uint)bVar10;
            ppsVar13 = &z->img_comp[0].data;
            do {
              *ppsVar13 = (stbi_uc *)0x0;
              ppsVar13[3] = (stbi_uc *)0x0;
              ppsVar13 = ppsVar13 + 0xc;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
            if (uVar2 == (uint)bVar10 + (uint)bVar10 * 2 + 8) {
              z->rgb = 0;
              piVar15 = &z->img_comp[0].tq;
              lVar17 = 0;
              do {
                iVar19 = (int)uVar20;
                if (pbVar8 < s->img_buffer_end) {
LAB_0012591e:
                  s->img_buffer = pbVar8 + 1;
                  bVar10 = *pbVar8;
                  pbVar8 = pbVar8 + 1;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar8 = s->img_buffer;
                    iVar19 = s->img_n;
                    goto LAB_0012591e;
                  }
                  bVar10 = 0;
                }
                ((anon_struct_96_18_0d0905d3 *)(piVar15 + -3))->id = (uint)bVar10;
                if ((iVar19 == 3) && (bVar10 == "RGB"[lVar17])) {
                  z->rgb = z->rgb + 1;
                }
                if (s->img_buffer_end <= pbVar8) {
                  if (s->read_from_callbacks == 0) {
                    piVar15[-2] = 0;
                    goto LAB_00125c9e;
                  }
                  stbi__refill_buffer(s);
                  pbVar8 = s->img_buffer;
                }
                pbVar12 = pbVar8 + 1;
                s->img_buffer = pbVar12;
                bVar10 = *pbVar8;
                piVar15[-2] = (uint)(bVar10 >> 4);
                if ((byte)(bVar10 + 0xb0) < 0xc0) goto LAB_00125c9e;
                piVar15[-1] = bVar10 & 0xf;
                if ((bVar10 & 0xf) - 5 < 0xfffffffc) goto LAB_00125c83;
                if (pbVar12 < s->img_buffer_end) {
LAB_001259ca:
                  s->img_buffer = pbVar12 + 1;
                  bVar10 = *pbVar12;
                  *piVar15 = (uint)bVar10;
                  pbVar8 = pbVar12 + 1;
                  if (3 < bVar10) {
                    pcVar6 = "bad TQ";
                    goto LAB_00125ca5;
                  }
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar12 = s->img_buffer;
                    goto LAB_001259ca;
                  }
                  *piVar15 = 0;
                  pbVar8 = pbVar12;
                }
                lVar17 = lVar17 + 1;
                iVar19 = s->img_n;
                uVar20 = (ulong)iVar19;
                piVar15 = piVar15 + 0x18;
              } while (lVar17 < (long)uVar20);
              if (scan != 0) {
                return 1;
              }
              sVar3 = s->img_x;
              b = s->img_y;
              iVar4 = stbi__mad3sizes_valid(sVar3,b,iVar19,0);
              if (iVar4 == 0) {
                *(char **)(in_FS_OFFSET + -0x20) = "too large";
                return 0;
              }
              uVar16 = 1;
              uVar2 = 1;
              if (0 < iVar19) {
                uVar16 = 1;
                lVar17 = 0;
                uVar2 = 1;
                do {
                  uVar5 = *(uint *)((long)&z->img_comp[0].h + lVar17);
                  uVar14 = *(uint *)((long)&z->img_comp[0].v + lVar17);
                  if ((int)uVar2 < (int)uVar5) {
                    uVar2 = uVar5;
                  }
                  if ((int)uVar16 < (int)uVar14) {
                    uVar16 = uVar14;
                  }
                  lVar17 = lVar17 + 0x60;
                } while (uVar20 * 0x60 != lVar17);
                if (0 < iVar19) {
                  lVar17 = 0;
                  do {
                    if ((int)uVar2 % *(int *)((long)&z->img_comp[0].h + lVar17) != 0)
                    goto LAB_00125c9e;
                    if ((int)uVar16 % *(int *)((long)&z->img_comp[0].v + lVar17) != 0)
                    goto LAB_00125c83;
                    lVar17 = lVar17 + 0x60;
                  } while (uVar20 * 0x60 != lVar17);
                }
              }
              uVar14 = ((sVar3 + uVar2 * 8) - 1) / (uVar2 * 8);
              uVar5 = ((b + uVar16 * 8) - 1) / (uVar16 * 8);
              z->img_h_max = uVar2;
              z->img_v_max = uVar16;
              z->img_mcu_w = uVar2 * 8;
              z->img_mcu_h = uVar16 * 8;
              z->img_mcu_x = uVar14;
              z->img_mcu_y = uVar5;
              if (iVar19 < 1) {
                return 1;
              }
              local_64 = 1;
              lVar17 = 0;
              while( true ) {
                iVar4 = *(int *)((long)&z->img_comp[0].h + lVar17);
                iVar18 = *(int *)((long)&z->img_comp[0].v + lVar17);
                *(uint *)((long)&z->img_comp[0].x + lVar17) = (iVar4 * sVar3 + (uVar2 - 1)) / uVar2;
                *(uint *)((long)&z->img_comp[0].y + lVar17) = (iVar18 * b + (uVar16 - 1)) / uVar16;
                iVar4 = iVar4 * uVar14;
                a = iVar4 * 8;
                *(int *)((long)&z->img_comp[0].w2 + lVar17) = a;
                iVar18 = iVar18 * uVar5;
                iVar19 = iVar18 * 8;
                *(int *)((long)&z->img_comp[0].h2 + lVar17) = iVar19;
                pvVar9 = stbi__malloc_mad2(a,iVar19,0xf);
                puVar1 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar17);
                *puVar1 = 0;
                puVar1[1] = 0;
                *(undefined8 *)((long)&z->img_comp[0].coeff + lVar17) = 0;
                *(void **)((long)&z->img_comp[0].raw_data + lVar17) = pvVar9;
                why = extraout_EDX;
                if (pvVar9 == (void *)0x0) break;
                *(ulong *)((long)&z->img_comp[0].data + lVar17) =
                     (long)pvVar9 + 0xfU & 0xfffffffffffffff0;
                if (z->progressive != 0) {
                  *(int *)((long)&z->img_comp[0].coeff_w + lVar17) = iVar4;
                  *(int *)((long)&z->img_comp[0].coeff_h + lVar17) = iVar18;
                  pvVar9 = stbi__malloc_mad3(a,iVar19,2,0xf);
                  *(void **)((long)&z->img_comp[0].raw_coeff + lVar17) = pvVar9;
                  why = extraout_EDX_00;
                  if (pvVar9 == (void *)0x0) break;
                  *(ulong *)((long)&z->img_comp[0].coeff + lVar17) =
                       (long)pvVar9 + 0xfU & 0xfffffffffffffff0;
                }
                local_64 = local_64 + 1;
                lVar17 = lVar17 + 0x60;
                if (uVar20 * 0x60 == lVar17) {
                  return 1;
                }
              }
              *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
              stbi__free_jpeg_components(z,local_64,why);
              return 0;
            }
            goto LAB_001257c3;
          }
        }
        else if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar12 = s->img_buffer;
          goto LAB_0012588b;
        }
        pcVar6 = "bad component count";
        goto LAB_00125ca5;
      }
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar7 = s->img_buffer;
      goto LAB_001257f8;
    }
    pcVar6 = "only 8-bit";
  }
  goto LAB_00125ca5;
LAB_00125c9e:
  pcVar6 = "bad H";
  goto LAB_00125ca5;
LAB_00125c83:
  pcVar6 = "bad V";
LAB_00125ca5:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar6;
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // check that plane subsampling factors are integer ratios; our resamplers can't deal with fractional ratios
   // and I've never seen a non-corrupted JPEG file actually use them
   for (i=0; i < s->img_n; ++i) {
      if (h_max % z->img_comp[i].h != 0) return stbi__err("bad H","Corrupt JPEG");
      if (v_max % z->img_comp[i].v != 0) return stbi__err("bad V","Corrupt JPEG");
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}